

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

Rect __thiscall SkylineBinPack::Insert(SkylineBinPack *this,int width,int height)

{
  bool bVar1;
  undefined1 local_38 [8];
  Rect node;
  int height_local;
  int width_local;
  SkylineBinPack *this_local;
  Rect newNode;
  
  node.width = height;
  node.height = width;
  _local_38 = GuillotineBinPack::Insert
                        (&this->wasteMap,width,height,true,RectBestShortSideFit,SplitMaximizeArea);
  bVar1 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)local_38);
  if (!bVar1) {
    __assert_fail("disjointRects.Disjoint(node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0x6d,"Rect SkylineBinPack::Insert(int, int)");
  }
  if (node.y == 0) {
    _this_local = InsertBottomLeft(this,node.height,node.width);
  }
  else {
    _this_local = _local_38;
    this->usedSurfaceArea = (long)(node.height * node.width) + this->usedSurfaceArea;
    bVar1 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&this_local);
    if (!bVar1) {
      __assert_fail("disjointRects.Disjoint(newNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0x79,"Rect SkylineBinPack::Insert(int, int)");
    }
    DisjointRectCollection::Add(&this->disjointRects,(Rect *)&this_local);
  }
  return _this_local;
}

Assistant:

Rect SkylineBinPack::Insert(int width, int height)
{
	// First try to pack this rectangle into the waste map, if it fits.
	Rect node = wasteMap.Insert(width, height, true, GuillotineBinPack::RectBestShortSideFit, 
		GuillotineBinPack::SplitMaximizeArea);
#ifdef _DEBUG
	assert(disjointRects.Disjoint(node));
#endif

	if (node.height != 0)
	{
		Rect newNode;
		newNode.x = node.x;
		newNode.y = node.y;
		newNode.width = node.width;
		newNode.height = node.height;
		usedSurfaceArea += width * height;
#ifdef _DEBUG
		assert(disjointRects.Disjoint(newNode));
		disjointRects.Add(newNode);
#endif
		return newNode;
	}
	
	return InsertBottomLeft(width, height);
}